

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set_allocator_test.cc
# Opt level: O0

void __thiscall phmap::priv::anon_unknown_0::PropagateTest<6>::PropagateTest(PropagateTest<6> *this)

{
  bool bVar1;
  char *pcVar2;
  AssertHelper local_90;
  Message local_88;
  allocator_type local_80;
  undefined1 local_68 [8];
  AssertionResult gtest_ar_1;
  Message local_50;
  allocator_type local_48;
  undefined1 local_30 [8];
  AssertionResult gtest_ar;
  PropagateTest<6> *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__PropagateTest_001e3ad0;
  CheckedAlloc<phmap::priv::Tracked<int>,_6>::CheckedAlloc(&this->a1,1);
  raw_hash_set<phmap::priv::(anonymous_namespace)::Policy,_phmap::priv::(anonymous_namespace)::Identity,_std::equal_to<int>,_phmap::priv::(anonymous_namespace)::CheckedAlloc<phmap::priv::Tracked<int>,_6>_>
  ::raw_hash_set(&this->t1,0,&this->a1);
  CheckedAlloc<phmap::priv::Tracked<int>,_6>::CheckedAlloc(&this->a2,2);
  raw_hash_set<phmap::priv::(anonymous_namespace)::Policy,_phmap::priv::(anonymous_namespace)::Identity,_std::equal_to<int>,_phmap::priv::(anonymous_namespace)::CheckedAlloc<phmap::priv::Tracked<int>,_6>_>
  ::get_allocator(&local_48,&this->t1);
  testing::internal::EqHelper::
  Compare<phmap::priv::(anonymous_namespace)::CheckedAlloc<phmap::priv::Tracked<int>,_6>,_phmap::priv::(anonymous_namespace)::CheckedAlloc<phmap::priv::Tracked<int>,_6>,_nullptr>
            ((EqHelper *)local_30,"a1","t1.get_allocator()",&this->a1,&local_48);
  CheckedAlloc<phmap::priv::Tracked<int>,_6>::~CheckedAlloc(&local_48);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_30);
  if (!bVar1) {
    testing::Message::Message(&local_50);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_30);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/raw_hash_set_allocator_test.cc"
               ,0xb4,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_50);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_50);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_30);
  raw_hash_set<phmap::priv::(anonymous_namespace)::Policy,_phmap::priv::(anonymous_namespace)::Identity,_std::equal_to<int>,_phmap::priv::(anonymous_namespace)::CheckedAlloc<phmap::priv::Tracked<int>,_6>_>
  ::get_allocator(&local_80,&this->t1);
  testing::internal::
  CmpHelperNE<phmap::priv::(anonymous_namespace)::CheckedAlloc<phmap::priv::Tracked<int>,6>,phmap::priv::(anonymous_namespace)::CheckedAlloc<phmap::priv::Tracked<int>,6>>
            ((internal *)local_68,"a2","t1.get_allocator()",&this->a2,&local_80);
  CheckedAlloc<phmap::priv::Tracked<int>,_6>::~CheckedAlloc(&local_80);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_68);
  if (!bVar1) {
    testing::Message::Message(&local_88);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_68);
    testing::internal::AssertHelper::AssertHelper
              (&local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/raw_hash_set_allocator_test.cc"
               ,0xb5,pcVar2);
    testing::internal::AssertHelper::operator=(&local_90,&local_88);
    testing::internal::AssertHelper::~AssertHelper(&local_90);
    testing::Message::~Message(&local_88);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_68);
  return;
}

Assistant:

PropagateTest() {
    EXPECT_EQ(a1, t1.get_allocator());
    EXPECT_NE(a2, t1.get_allocator());
  }